

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.h
# Opt level: O3

bool __thiscall
cmInstallRuntimeDependencySet::AddBundleExecutable
          (cmInstallRuntimeDependencySet *this,cmInstallTargetGenerator *bundleExecutable)

{
  bool bVar1;
  pointer *__ptr;
  __uniq_ptr_impl<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl =
       (tuple<cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
        )operator_new(0x10);
  *(undefined ***)
   local_18._M_t.
   super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
   .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl =
       &PTR__Item_00bbc030;
  *(cmInstallTargetGenerator **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
          .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl + 8) =
       bundleExecutable;
  bVar1 = AddBundleExecutable(this,(unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
                                    *)&local_18);
  if ((_Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
       )local_18._M_t.
        super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
        .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl !=
      (Item *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
                          .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>.
                          _M_head_impl + 8))();
  }
  return bVar1;
}

Assistant:

bool AddBundleExecutable(cmInstallTargetGenerator* bundleExecutable)
  {
    return this->AddBundleExecutable(
      cm::make_unique<TargetItem>(bundleExecutable));
  }